

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::
MidSideNodeIndex(TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                 *this,int side,int64_t *index)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  TPZGeoNode *pTVar7;
  long *plVar8;
  ulong uVar9;
  REAL RVar10;
  TPZVec<double> auxpt;
  TPZVec<double> centerpt;
  TPZStack<long,_10> msnindex;
  TPZStack<TPZGeoElSide,_10> subels;
  double local_218;
  double local_210;
  double local_200;
  TPZVec<double> local_1f8;
  TPZVec<double> local_1d8;
  double local_1b8;
  TPZManVector<long,_10> local_1b0;
  undefined **local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [240];
  
  *index = -1;
  if (-1 < side) {
    iVar2 = (**(code **)(*(long *)&(this->
                                   super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                   ).super_TPZGeoEl + 0xf0))();
    if (side < iVar2) {
      iVar2 = (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                     ).super_TPZGeoEl + 0x98))(this);
      lVar6 = *(long *)&(this->
                        super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                        ).super_TPZGeoEl;
      if (side < iVar2) {
        iVar5 = (**(code **)(lVar6 + 0xa8))(this,side);
        *index = iVar5;
      }
      else {
        iVar2 = (**(code **)(lVar6 + 0x1d0))(this);
        if (iVar2 != 0) {
          uVar3 = (**(code **)(*(long *)&(this->
                                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                         ).super_TPZGeoEl + 0x150))(this,side);
          lVar6 = 0x30;
          do {
            *(undefined ***)((long)local_1b0.fExtAlloc + lVar6 + 0x40) = &PTR__TPZGeoElSide_018f8760
            ;
            *(undefined8 *)((long)local_1b0.fExtAlloc + lVar6 + 0x48) = 0;
            *(undefined4 *)((long)&local_140 + lVar6) = 0xffffffff;
            lVar6 = lVar6 + 0x18;
          } while (lVar6 != 0x120);
          local_138 = local_120;
          local_130 = 0;
          uStack_128 = 0;
          local_140 = &PTR__TPZManVector_0181a6d0;
          (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                 ).super_TPZGeoEl + 0x268))(this,side,&local_140);
          if (uVar3 == 1) {
            (**(code **)(**(long **)(local_138 + 8) + 0x118))
                      (*(long **)(local_138 + 8),*(undefined4 *)(local_138 + 0x10),index);
          }
          else {
            TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_1b0);
            if (0 < (int)uVar3) {
              lVar6 = 0;
              do {
                iVar2 = *(int *)(local_138 + lVar6 + 0x10);
                iVar4 = (**(code **)(**(long **)(local_138 + lVar6 + 8) + 0x98))();
                if (iVar2 < iVar4) {
                  iVar5 = TPZGeoElSide::SideNodeIndex((TPZGeoElSide *)(local_138 + lVar6),0);
                  TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_1b0,iVar5);
                }
                lVar6 = lVar6 + 0x18;
              } while ((ulong)uVar3 * 0x18 != lVar6);
            }
            if (1 < local_1b0.super_TPZVec<long>.fNElements) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..."
                         ,0x59);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
            }
            if (local_1b0.super_TPZVec<long>.fNElements == 0) {
              *index = -1;
            }
            else if (local_1b0.super_TPZVec<long>.fNElements == 1) {
              *index = *local_1b0.super_TPZVec<long>.fStore;
            }
            else {
              iVar2 = (**(code **)(*(long *)&(this->
                                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                             ).super_TPZGeoEl + 0x210))(this);
              local_1f8._vptr_TPZVec = (_func_int **)0x0;
              TPZVec<double>::TPZVec(&local_1d8,(long)iVar2,(double *)&local_1f8);
              iVar2 = (**(code **)(*(long *)&(this->
                                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                             ).super_TPZGeoEl + 0x210))(this);
              local_1b8 = 0.0;
              TPZVec<double>::TPZVec(&local_1f8,(long)iVar2,&local_1b8);
              (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                     ).super_TPZGeoEl + 0x260))(this,side,&local_1f8);
              (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                     ).super_TPZGeoEl + 0x228))(this,&local_1f8,&local_1d8);
              *index = *local_1b0.super_TPZVec<long>.fStore;
              if (0 < local_1b0.super_TPZVec<long>.fNElements) {
                local_200 = 1000000.0;
                local_218 = 0.0;
                lVar6 = 0;
                do {
                  uVar9 = 0;
                  while( true ) {
                    iVar2 = (**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                                  ).super_TPZGeoEl + 0x210))(this);
                    if ((long)iVar2 <= (long)uVar9) break;
                    pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                       (&(((this->
                                           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                           ).super_TPZGeoEl.fMesh)->fNodeVec).
                                         super_TPZChunkVector<TPZGeoNode,_10>,
                                        local_1b0.super_TPZVec<long>.fStore[lVar6]);
                    if (uVar9 < 3) {
                      local_210 = pTVar7->fCoord[uVar9];
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Not exist (TPZGeoNode) coordinate ",0x22);
                      plVar8 = (long *)std::ostream::operator<<(&std::cerr,(int)uVar9);
                      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                      std::ostream::put((char)plVar8);
                      std::ostream::flush();
                      local_210 = 1000000000000.0;
                    }
                    dVar1 = local_1d8.fStore[uVar9];
                    pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                       (&(((this->
                                           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                           ).super_TPZGeoEl.fMesh)->fNodeVec).
                                         super_TPZChunkVector<TPZGeoNode,_10>,
                                        local_1b0.super_TPZVec<long>.fStore[lVar6]);
                    if (uVar9 < 3) {
                      RVar10 = pTVar7->fCoord[uVar9];
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Not exist (TPZGeoNode) coordinate ",0x22);
                      plVar8 = (long *)std::ostream::operator<<(&std::cerr,(int)uVar9);
                      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                      std::ostream::put((char)plVar8);
                      std::ostream::flush();
                      RVar10 = 1000000000000.0;
                    }
                    local_218 = local_218 + (local_210 - dVar1) * (RVar10 - local_1d8.fStore[uVar9])
                    ;
                    uVar9 = uVar9 + 1;
                  }
                  if (local_218 < local_200) {
                    *index = local_1b0.super_TPZVec<long>.fStore[lVar6];
                    local_200 = local_218;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < local_1b0.super_TPZVec<long>.fNElements);
              }
              local_1f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              if (local_1f8.fStore != (double *)0x0) {
                operator_delete__(local_1f8.fStore);
              }
              local_1d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
              if (local_1d8.fStore != (double *)0x0) {
                operator_delete__(local_1d8.fStore);
              }
            }
            TPZManVector<long,_10>::~TPZManVector(&local_1b0);
          }
          if (local_138 != local_120) {
            uStack_128 = 0;
            local_140 = &PTR__TPZVec_018141b0;
            if (local_138 != (undefined1 *)0x0) {
              operator_delete__(local_138 + -8,*(long *)(local_138 + -8) * 0x18 + 8);
            }
          }
        }
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = ",
             0x3b);
  plVar8 = (long *)std::ostream::operator<<(&std::cerr,side);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndex(int side,int64_t &index) const {
	index = -1;
	int i,j;
	if(side<0 || side>this->NSides()-1) {
		PZError << "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	//corner side
	if(side<this->NCornerNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = this->NodeIndex(side);
		return;
	}
	//o n�medio da face �o centro e o n�medio do centro �o centro
	//como n�de algum filho se este existir
	//caso tenha filhos �o canto de algum filho, se n� tiver filhos retorna -1
	if(HasSubElement()) {
		//side -= NCornerNodes();
		//index =(gel->SubElement(MidSideNodes[side][0]))->NodeIndex(MidSideNodes[side][1]);
		int nsubel = this->NSideSubElements(side);
		TPZStack <TPZGeoElSide> subels;
		GetSubElements2(side,subels);
		// Nao sei porque deve se fazer esta execao
		if (nsubel == 1) {
			subels[0].Element()->MidSideNodeIndex(subels[0].Side(),index);
			return;
		}
		TPZStack <int64_t> msnindex;
		// este sidenodeindex pode nao existir. Normalmente o numero de nos de um elemento e igual
		// NNodes. Quer dizer se o lado e maior igual NNodes, este metodo nao devolvera nada
		
		int64_t subnodeindex;
		for (i=0;i<nsubel;i++){
			if(subels[i].Side() >= subels[i].Element()->NCornerNodes()) continue;
			subnodeindex = subels[i].SideNodeIndex(0);
			msnindex.Push(subnodeindex);
		}
		if(msnindex.NElements() > 1) {
			std::cout << "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..." << std::endl;
		}
		if (msnindex.NElements() == 1) index = msnindex[0];
		else if(msnindex.NElements() == 0) {
			index = -1;
		} else {
			TPZVec<REAL> centerpt(this->Dimension(),0.);
			TPZVec<REAL> auxpt(this->Dimension(),0.);
			this->CenterPoint(side,auxpt);
			this->X(auxpt,centerpt);
			
			REAL dif = 1e6;
			REAL aux = 0;
			index = msnindex[0];
			for (i=0;i<msnindex.NElements();i++){
				for (j=0;j<this->Dimension();j++)
					aux += (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]) *
                    (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]);
				if (aux < dif){
					dif = aux;
					index = msnindex[i];
				}
			}
		}
	}
}